

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NetIF.hpp
# Opt level: O1

vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* __thiscall
gmlc::netif::getInterfaceAddresses_abi_cxx11_
          (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *__return_storage_ptr__,netif *this,int family)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  ushort uVar2;
  bool bVar3;
  long lVar4;
  size_t sVar5;
  undefined8 *puVar6;
  undefined4 in_register_00000014;
  undefined8 *puVar7;
  string ipAddr;
  IF_ADDRS allAddrs;
  char addr_str [46];
  value_type local_90;
  undefined8 *local_70;
  char local_68 [56];
  
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_70 = (undefined8 *)0x0;
  getifaddrs(&local_70,this,CONCAT44(in_register_00000014,family));
  if (local_70 != (undefined8 *)0x0) {
    paVar1 = &local_90.field_2;
    puVar7 = local_70;
    do {
      uVar2 = *(ushort *)puVar7[3];
      if (uVar2 == 2) {
        lVar4 = 4;
LAB_0043328b:
        inet_ntop((uint)uVar2,(void *)((long)puVar7[3] + lVar4),local_68,0x2e);
        local_90._M_dataplus._M_p = (pointer)paVar1;
        sVar5 = strlen(local_68);
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_90,local_68,local_68 + sVar5);
      }
      else {
        if (uVar2 == 10) {
          lVar4 = 8;
          goto LAB_0043328b;
        }
        local_90._M_string_length = 0;
        local_90.field_2._M_local_buf[0] = '\0';
        local_90._M_dataplus._M_p = (pointer)paVar1;
      }
      if (local_90._M_string_length != 0) {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(__return_storage_ptr__,&local_90);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_90._M_dataplus._M_p != paVar1) {
        operator_delete(local_90._M_dataplus._M_p,
                        CONCAT71(local_90.field_2._M_allocated_capacity._1_7_,
                                 local_90.field_2._M_local_buf[0]) + 1);
      }
      puVar6 = (undefined8 *)*puVar7;
      do {
        if (puVar6 == (undefined8 *)0x0) {
          puVar7 = (undefined8 *)0x0;
          break;
        }
        if ((ushort *)puVar6[3] == (ushort *)0x0) {
LAB_00433331:
          puVar6 = (undefined8 *)*puVar6;
          bVar3 = true;
        }
        else {
          uVar2 = *(ushort *)puVar6[3];
          if (((uVar2 & 0xfff7) != 2) ||
             (((uint)this & 0xfffffff7) == 2 && (uint)uVar2 != (uint)this)) goto LAB_00433331;
          bVar3 = false;
          puVar7 = puVar6;
        }
      } while (bVar3);
    } while (puVar7 != (undefined8 *)0x0);
  }
  if (local_70 != (undefined8 *)0x0) {
    freeifaddrs();
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<std::string> getInterfaceAddresses(int family)
    {
        std::vector<std::string> result_list;

        IF_ADDRS allAddrs = NULL;

        getAddresses(family, &allAddrs);

#if defined(_WIN32) || defined(__USE_W32_SOCKETS)
        WSADATA wsaData;
        if (WSAStartup(0x202, &wsaData) != 0) {
            return result_list;
        }
        auto winAddrs = allAddrs;
        while (winAddrs) {
            auto addrs = winAddrs->FirstUnicastAddress;
#else
        auto addrs = allAddrs;
#endif

            for (auto a = addrs; a != NULL; a = getNextAddress(family, a)) {
                std::string ipAddr = addressToString(getSockAddr(a), getSockAddrLen(a));
                if (!ipAddr.empty()) {
                    result_list.push_back(ipAddr);
                }
            }

#if defined(_WIN32) || defined(__USE_W32_SOCKETS)
            winAddrs = winAddrs->Next;
        }
        WSACleanup();
#endif

        if (allAddrs) {
            freeAddresses(allAddrs);
        }
        return result_list;
    }